

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

void parout(void)

{
  Symbol *pSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Item *pIVar8;
  List *pLVar9;
  ulong uVar10;
  List *lst;
  int type;
  double d1_2;
  int itype;
  int need_style;
  int dcurdef;
  int i_3;
  int j_2;
  char *var_suffix;
  int i_2;
  int i_1;
  double d2_1;
  double d1_1;
  int cnt;
  int j_1;
  int redefine_nrn_ghk;
  int add_celsius;
  Symbol *s_1;
  double d2;
  double d1;
  Symbol *sion;
  Symbol *s;
  Item *extra_pragma_loop_arg;
  Item *q1;
  Item *q;
  int emit_check_table_thread;
  int gind;
  int pointercount;
  int ioncount;
  int j;
  int i;
  char *in_stack_fffffffffffffed8;
  char *p;
  undefined4 uVar11;
  List *in_stack_fffffffffffffee0;
  char *list;
  char *name;
  char *s_00;
  char *sym;
  char *pg2;
  char *sym_00;
  Symbol *in_stack_ffffffffffffff10;
  uint local_e4;
  uint local_d4;
  undefined8 local_a8;
  int local_90;
  uint local_8c;
  char *local_88;
  int local_80;
  int local_7c;
  int *in_stack_ffffffffffffff90;
  undefined8 uVar12;
  uint local_68;
  int local_64;
  undefined8 local_48;
  Item *local_28;
  Item *local_20;
  uint local_14;
  int local_10;
  uint local_c;
  uint local_4;
  
  cvode_emit = 0;
  defs_list = newlist();
  if (brkpnt_exists == 0) {
    brkpnt_str_ = "NULL, NULL, NULL";
  }
  else if (vectorize == 0) {
    brkpnt_str_ = "nrn_cur, nrn_jacob, nrn_state";
  }
  else {
    brkpnt_str_ = "nrn_cur, NULL, nrn_state";
  }
  set_suffix();
  if (((artificial_cell != 0) && (vectorize != 0)) &&
     ((thread_data_index != 0 || (toplocal_ != (List *)0x0)))) {
    fprintf(_stderr,
            "Notice: ARTIFICIAL_CELL models that would require thread specific data are not thread safe.\n"
           );
    vectorize = 0;
  }
  if (point_process == 0) {
    rsuffix = suffix;
  }
  else {
    rsuffix = "";
    if ((artificial_cell == 0) && (net_receive_ != 0)) {
      net_receive_buffering_ = 1;
      emit_net_receive_buffering_code();
    }
  }
  lappendstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (use_bbcorepointer != 0) {
    lappendstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    lappendstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    lappendstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  lappendstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (vectorize == 0) {
    lappendstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  else {
    lappendstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (protect_include_ == 0) {
      insertstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
    else {
      insertstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
  }
  if (net_receive_buffering_ != 0) {
    lappendstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  p = suffix;
  list = suffix;
  name = suffix;
  s_00 = suffix;
  sym = suffix;
  pg2 = suffix;
  sym_00 = suffix;
  sprintf(buf,
          "\n#define nrn_init _nrn_init_%s\n#define nrn_cur _nrn_cur_%s\n#define _nrn_current _nrn_current_%s\n#define nrn_jacob _nrn_jacob_%s\n#define nrn_state _nrn_state_%s\n#define initmodel initmodel_%s\n#define _net_receive _net_receive_%s\n#define _net_init _net_init_%s\n#define nrn_state_launcher nrn_state%s_launcher\n#define nrn_cur_launcher nrn_cur%s_launcher\n#define nrn_jacob_launcher nrn_jacob%s_launcher"
          ,suffix,suffix,suffix,suffix);
  lappendstr((List *)list,p);
  if (net_receive_buffering_ != 0) {
    sprintf(buf,
            "\n#if NET_RECEIVE_BUFFERING\n#define _net_buf_receive _net_buf_receive%s\nvoid _net_buf_receive(NrnThread*);\n#endif\n"
            ,suffix);
    lappendstr((List *)list,p);
  }
  if (watch_seen_ != 0) {
    sprintf(buf,"\n#define _nrn_watch_check _nrn_watch_check_%s",suffix);
    lappendstr((List *)list,p);
  }
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      pIVar8 = (local_20->element).itm;
      if ((pIVar8->itemtype == 0x13e) && (((ulong)(pIVar8->element).itm & 0x680) != 0)) {
        sprintf(buf,"\n#define %s %s%s",pIVar8[2].element.itm,pIVar8[2].element.itm,suffix);
        lappendstr((List *)list,p);
      }
    }
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if (vectorize == 0) {
    lappendstr((List *)list,p);
  }
  else {
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  if (vectorize == 0) {
    sprintf(buf,"static double *_p; static Datum *_ppvar;\n");
  }
  else {
    sprintf(buf,"/* Thread safe. No static _p or _ppvar. */\n");
  }
  lappendstr((List *)list,p);
  nrndeclare();
  parraycount = 0;
  varcount = 0;
  declare_p();
  iVar5 = iondef(in_stack_ffffffffffffff90);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if (local_10 == 0) {
    sprintf(buf,"-1;\n");
  }
  else {
    sprintf(buf,"%d;\n",(ulong)(uint)((nrnpointers->next->element).sym)->used);
  }
  lappendstr((List *)list,p);
  if (vectorize != 0) {
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  bVar2 = false;
  bVar3 = false;
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      pSVar1 = (local_20->element).sym;
      iVar6 = strcmp(pSVar1->name,"nrn_ghk");
      if ((iVar6 == 0) && ((pSVar1->subtype & 0x8000U) != 0)) {
        bVar2 = true;
        bVar3 = true;
      }
      if ((pSVar1->nrntype & 1U) != 0) {
        iVar6 = strcmp(pSVar1->name,"celsius");
        if (iVar6 == 0) {
          bVar2 = true;
        }
        else {
          iVar6 = strcmp(pSVar1->name,"dt");
          if ((iVar6 != 0) && (iVar6 = strcmp(pSVar1->name,"t"), iVar6 != 0)) {
            if ((pSVar1->subtype & 0x20U) == 0) {
              sprintf(buf,"extern double %s;\n",pSVar1->name);
            }
            else {
              sprintf(buf,"extern double* %s;\n",pSVar1->name);
            }
            lappendstr((List *)list,p);
            iVar6 = strcmp(pSVar1->name,"secondorder");
            if ((iVar6 != 0) || (iVar6 = strcmp(pSVar1->name,"pi"), iVar6 != 0)) {
              add_global_var(s_00,name,(int)((ulong)list >> 0x20),(int)list,(int)((ulong)p >> 0x20),
                             (int)p);
            }
          }
        }
      }
    }
  }
  if (bVar2) {
    lappendstr((List *)list,p);
    add_global_var(s_00,name,(int)((ulong)list >> 0x20),(int)list,(int)((ulong)p >> 0x20),(int)p);
  }
  if (bVar3) {
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      pSVar1 = (local_20->element).sym;
      if (((pSVar1->subtype & 0xc0U) != 0) && (*pSVar1->name != '_')) {
        if (point_process == 0) {
          sprintf(buf,"static void _hoc_%s(void);\n",pSVar1->name);
        }
        else {
          sprintf(buf,"static double _hoc_%s();\n",pSVar1->name);
        }
        lappendstr((List *)list,p);
      }
    }
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if (point_process != 0) {
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if (point_process == 0) {
    sprintf(buf,"\"setdata_%s\", _hoc_setdata,\n",mechname);
    lappendstr((List *)list,p);
  }
  else {
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    sprintf(buf,"\"loc\", _hoc_loc_pnt,\n");
    lappendstr((List *)list,p);
    sprintf(buf,"\"has_loc\", _hoc_has_loc,\n");
    lappendstr((List *)list,p);
    sprintf(buf,"\"get_loc\", _hoc_get_loc_pnt,\n");
    lappendstr((List *)list,p);
  }
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      pSVar1 = (local_20->element).sym;
      if (((pSVar1->subtype & 0xc0U) != 0) && (*pSVar1->name != '_')) {
        sprintf(buf,"\"%s%s\", _hoc_%s,\n",pSVar1->name,rsuffix,pSVar1->name);
        lappendstr((List *)list,p);
      }
    }
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if (suffix[0] != '\0') {
    for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
      for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
          local_20 = local_20->next) {
        pSVar1 = (local_20->element).sym;
        if ((pSVar1->subtype & 0x40U) != 0) {
          sprintf(buf,"#define %s %s%s\n",pSVar1->name,pSVar1->name,suffix);
          pIVar8 = lappendstr((List *)list,p);
          pIVar8->itemtype = 0x102;
        }
      }
    }
  }
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      pSVar1 = (local_20->element).sym;
      if ((pSVar1->subtype & 0x40U) != 0) {
        if (artificial_cell == 0) {
          lappendstr((List *)list,p);
        }
        sprintf(buf,"inline double %s(",pSVar1->name);
        lappendstr((List *)list,p);
        if ((vectorize != 0) && (pSVar1->no_threadargs == 0)) {
          if (pSVar1->varnum == 0) {
            lappendstr((List *)list,p);
          }
          else {
            lappendstr((List *)list,p);
          }
        }
        for (local_64 = 0; local_64 < pSVar1->varnum; local_64 = local_64 + 1) {
          lappendstr((List *)list,p);
          if (local_64 + 1 < pSVar1->varnum) {
            lappendstr((List *)list,p);
          }
        }
        lappendstr((List *)list,p);
      }
    }
  }
  bVar2 = false;
  if ((vectorize != 0) && (iVar6 = check_tables_threads((List *)p), iVar6 != 0)) {
    bVar2 = true;
  }
  if ((vectorize != 0) && (toplocal_ != (List *)0x0)) {
    local_68 = 0;
    for (local_20 = toplocal_->next; local_20 != toplocal_; local_20 = local_20->next) {
      if (((local_20->element).sym)->assigned_to_ != 2) {
        if ((((local_20->element).sym)->subtype & 0x20U) == 0) {
          local_68 = local_68 + 1;
        }
        else {
          local_68 = ((local_20->element).sym)->araydim + local_68;
        }
      }
    }
    sprintf(buf,"  _thread[%d]._pval = (double*)ecalloc(%d, sizeof(double));\n",
            (ulong)(uint)thread_data_index,(ulong)local_68);
    lappendstr((List *)list,p);
    sprintf(buf,"  free((void*)(_thread[%d]._pval));\n",(ulong)(uint)thread_data_index);
    lappendstr((List *)list,p);
    local_68 = 0;
    for (local_20 = toplocal_->next; local_20 != toplocal_; local_20 = local_20->next) {
      if (((local_20->element).sym)->assigned_to_ == 2) {
        if ((((local_20->element).sym)->subtype & 0x20U) == 0) {
          sprintf(buf,"static double %s;\n",((local_20->element).sym)->name);
        }
        else {
          sprintf(buf,"static double %s[%d];\n",((local_20->element).sym)->name,
                  (ulong)(uint)((local_20->element).sym)->araydim);
        }
      }
      else if ((((local_20->element).sym)->subtype & 0x20U) == 0) {
        sprintf(buf,"#define %s _thread[%d]._pval[%d]\n",((local_20->element).sym)->name,
                (ulong)(uint)thread_data_index,(ulong)local_68);
        local_68 = local_68 + 1;
      }
      else {
        sprintf(buf,"#define %s (_thread[%d]._pval + %d)\n",((local_20->element).sym)->name,
                (ulong)(uint)thread_data_index,(ulong)local_68);
        local_68 = ((local_20->element).sym)->araydim + local_68;
      }
      lappendstr((List *)list,p);
    }
    thread_data_index = thread_data_index + 1;
  }
  local_14 = 0;
  if (vectorize != 0) {
    for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
      for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
          local_20 = local_20->next) {
        pSVar1 = (local_20->element).sym;
        if (((pSVar1->nrntype & 0x40U) != 0) && (pSVar1->assigned_to_ == 1)) {
          if ((pSVar1->subtype & 0x20U) == 0) {
            local_14 = local_14 + 1;
          }
          else {
            local_14 = pSVar1->araydim + local_14;
          }
        }
      }
    }
  }
  lappendstr((List *)list,p);
  if (local_14 != 0) {
    sprintf(buf,
            "static int _thread1data_inuse = 0;\nstatic double _thread1data[%d];\n#define _gth %d\n"
            ,(ulong)local_14,(ulong)(uint)thread_data_index);
    lappendstr((List *)list,p);
    sprintf(buf,
            " if (_thread1data_inuse) {_thread[_gth]._pval = (double*)ecalloc(%d, sizeof(double));\n }else{\n _thread[_gth]._pval = _thread1data; _thread1data_inuse = 1;\n }\n"
            ,(ulong)local_14);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    thread_data_index = thread_data_index + 1;
  }
  local_14 = 0;
  globals_update_list = newlist();
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      pSVar1 = (local_20->element).sym;
      if ((pSVar1->nrntype & 0x40U) != 0) {
        if ((vectorize == 0) || (pSVar1->assigned_to_ != 1)) {
          decode_ustr(in_stack_ffffffffffffff10,(double *)sym_00,(double *)pg2,sym);
          if ((pSVar1->subtype & 0x20U) == 0) {
            sprintf(buf,"static double %s%s = %g;\n",local_48,pSVar1->name,suffix);
            add_global_var(s_00,name,(int)((ulong)list >> 0x20),(int)list,(int)((ulong)p >> 0x20),
                           (int)p);
          }
          else {
            sprintf(buf,"static double %s%s[%d];\n",pSVar1->name,suffix,(ulong)(uint)pSVar1->araydim
                   );
            add_global_var(s_00,name,(int)((ulong)list >> 0x20),(int)list,(int)((ulong)p >> 0x20),
                           (int)p);
          }
          lappendstr((List *)list,p);
        }
        else {
          uVar11 = (undefined4)((ulong)p >> 0x20);
          if ((pSVar1->subtype & 0x20U) == 0) {
            p = (char *)CONCAT44(uVar11,local_14);
            sprintf(buf,"#define %s%s _thread1data[%d]\n#define %s _thread[_gth]._pval[%d]\n",
                    pSVar1->name,suffix,(ulong)local_14,pSVar1->name);
          }
          else {
            p = (char *)CONCAT44(uVar11,local_14);
            sprintf(buf,"#define %s%s (_thread1data + %d)\n#define %s (_thread[_gth]._pval + %d)\n",
                    pSVar1->name,suffix,(ulong)local_14,pSVar1->name);
          }
          pIVar8 = lappendstr((List *)list,p);
          pIVar8->itemtype = 0x102;
          if ((pSVar1->subtype & 0x20U) == 0) {
            local_14 = local_14 + 1;
          }
          else {
            local_14 = pSVar1->araydim + local_14;
          }
        }
      }
    }
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      pSVar1 = (local_20->element).sym;
      if ((pSVar1->subtype & 2U) != 0) {
        uVar12 = 0;
        iVar6 = decode_limits((Symbol *)sym_00,(double *)pg2,(double *)sym);
        if (iVar6 != 0) {
          if (((pSVar1->nrntype & 0x40U) == 0) && (point_process != 0)) {
            sprintf(buf,"\"%s\", %g, %g,\n",uVar12,0,pSVar1->name);
          }
          else {
            sprintf(buf,"\"%s%s\", %g, %g,\n",uVar12,0,pSVar1->name,suffix);
          }
          lappendstr((List *)list,p);
        }
      }
    }
  }
  lappendstr((List *)list,p);
  units_reg();
  lappendstr((List *)list,p);
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      pSVar1 = (local_20->element).sym;
      if ((pSVar1->nrntype & 0x80U) != 0) {
        decode_ustr(in_stack_ffffffffffffff10,(double *)sym_00,(double *)pg2,sym);
        if ((pSVar1->subtype & 0x20U) == 0) {
          sprintf(buf,"static double %s = %g;\n",local_48,pSVar1->name);
          add_global_var(s_00,name,(int)((ulong)list >> 0x20),(int)list,(int)((ulong)p >> 0x20),
                         (int)p);
        }
        else {
          sprintf(buf,"static double %s[%d];\n",pSVar1->name,(ulong)(uint)pSVar1->araydim);
          add_global_var(s_00,name,(int)((ulong)list >> 0x20),(int)list,(int)((ulong)p >> 0x20),
                         (int)p);
        }
        lappendstr((List *)list,p);
      }
    }
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  for (local_20 = syminorder->next; local_20 != syminorder; local_20 = local_20->next) {
    pSVar1 = (local_20->element).sym;
    if (((pSVar1->nrntype & 0x40U) != 0) && ((pSVar1->subtype & 0x20U) == 0)) {
      sprintf(buf,"\"%s%s\", &%s%s,\n",pSVar1->name,suffix,pSVar1->name);
      lappendstr((List *)list,p);
    }
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  for (local_20 = syminorder->next; local_20 != syminorder; local_20 = local_20->next) {
    pSVar1 = (local_20->element).sym;
    if (((pSVar1->nrntype & 0x40U) != 0) && ((pSVar1->subtype & 0x20U) != 0)) {
      p = (char *)CONCAT44((int)((ulong)p >> 0x20),pSVar1->araydim);
      sprintf(buf,"\"%s%s\", %s%s, %d,\n",pSVar1->name,suffix,pSVar1->name);
      lappendstr((List *)list,p);
    }
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if (0 < ba_index_) {
    lappendstr((List *)list,p);
    for (local_4 = 2; (int)local_4 <= ba_index_; local_4 = local_4 + 1) {
      sprintf(buf,", _ba%d(NrnThread*, Memb_list*, int)",(ulong)local_4);
      lappendstr((List *)list,p);
    }
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if ((brkpnt_exists != 0) && (lappendstr((List *)list,p), vectorize == 0)) {
    lappendstr((List *)list,p);
  }
  if (watch_seen_ != 0) {
    lappendstr((List *)list,p);
  }
  ppvar_cnt = iVar5 + diamdec + local_10 + areadec;
  if (net_send_seen_ != 0) {
    tqitem_index = ppvar_cnt;
    ppvar_semantics((int)((ulong)list >> 0x20),p);
    ppvar_cnt = ppvar_cnt + 1;
  }
  if (watch_seen_ != 0) {
    watch_index = ppvar_cnt;
    for (local_4 = 0; (int)local_4 < watch_seen_; local_4 = local_4 + 1) {
      ppvar_semantics((int)((ulong)list >> 0x20),p);
    }
    ppvar_cnt = watch_seen_ + ppvar_cnt;
    sprintf(buf,"\n#define _watch_array(arg) _ppvar[(arg + %d)*_STRIDE]",(ulong)(uint)watch_index);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    sprintf(buf,
            "\n#define _nrn_watch_activate(_item)\\\n  if (_watch_rm == 0) {\\\n    int _i;\\\n    for (_i = 1; _i < %d; ++_i) {\\\n      _watch_array(_i) = 0;\\\n    }\\\n    _watch_rm = 1;\\\n  }\\\n  _watch_array(_item) = 2 +"
            ,(ulong)(uint)watch_seen_);
    lappendstr((List *)list,p);
  }
  if (for_netcons_ != 0) {
    sprintf(buf,"\n#define _fnc_index %d\n",(ulong)(uint)ppvar_cnt);
    lappendstr((List *)list,p);
    ppvar_semantics((int)((ulong)list >> 0x20),p);
    ppvar_cnt = ppvar_cnt + 1;
  }
  if (point_process != 0) {
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    if ((watch_seen_ != 0) || (for_netcons_ != 0)) {
      lappendstr((List *)list,p);
    }
    if (for_netcons_ != 0) {
      sprintf(buf,"  if (_prop) { _nrn_free_fornetcon(&(_prop->dparam[_fnc_index]._pvoid));}\n");
      lappendstr((List *)list,p);
    }
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
  }
  if (cvode_emit != 0) {
    cvode_ieq_index = ppvar_cnt;
    ppvar_semantics((int)((ulong)list >> 0x20),p);
    ppvar_cnt = ppvar_cnt + 1;
  }
  cvode_emit_interface();
  if (destructorfunc->next != destructorfunc) {
    if (point_process == 0) {
      diag(list,p);
    }
    lappendstr((List *)list,p);
  }
  if (constructorfunc->next != constructorfunc) {
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  sprintf(buf,"\"%s\",\n\"%s\",\n",nmodl_version_,mechname);
  lappendstr((List *)list,p);
  for (local_20 = rangeparm->next; local_20 != rangeparm; local_20 = local_20->next) {
    pSVar1 = (local_20->element).sym;
    if ((pSVar1->subtype & 0x20U) == 0) {
      sprintf(buf,"\"%s%s\",\n",pSVar1->name,rsuffix);
    }
    else {
      sprintf(buf,"\"%s%s[%d]\",\n",pSVar1->name,rsuffix,(ulong)(uint)pSVar1->araydim);
    }
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  for (local_20 = rangedep->next; local_20 != rangedep; local_20 = local_20->next) {
    pSVar1 = (local_20->element).sym;
    if ((pSVar1->subtype & 0x20U) == 0) {
      sprintf(buf,"\"%s%s\",\n",pSVar1->name,rsuffix);
    }
    else {
      sprintf(buf,"\"%s%s[%d]\",\n",pSVar1->name,rsuffix,(ulong)(uint)pSVar1->araydim);
    }
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  for (local_20 = rangestate->next; local_20 != rangestate; local_20 = local_20->next) {
    pSVar1 = (local_20->element).sym;
    if ((pSVar1->subtype & 0x20U) == 0) {
      sprintf(buf,"\"%s%s\",\n",pSVar1->name,rsuffix);
    }
    else {
      sprintf(buf,"\"%s%s[%d]\",\n",pSVar1->name,rsuffix,(ulong)(uint)pSVar1->araydim);
    }
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  for (local_20 = nrnpointers->next; local_20 != nrnpointers; local_20 = local_20->next) {
    pSVar1 = (local_20->element).sym;
    if ((pSVar1->subtype & 0x20U) == 0) {
      sprintf(buf,"\"%s%s\",\n",pSVar1->name,rsuffix);
    }
    else {
      sprintf(buf,"\"%s%s[%d]\",\n",pSVar1->name,rsuffix,(ulong)(uint)pSVar1->araydim);
    }
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  if (diamdec != 0) {
    lappendstr((List *)list,p);
  }
  for (local_20 = useion->next; local_20 != useion; local_20 = local_20->next->next->next->next) {
    pSVar1 = (local_20->element).sym;
    sprintf(buf,"static int _%s_type;\n",pSVar1->name);
    lappendstr((List *)list,p);
    if (ldifuslist != (List *)0x0) {
      sprintf(buf,"static int _type_i%s;\n",pSVar1->name);
      lappendstr((List *)list,p);
    }
  }
  lappendstr((List *)list,p);
  for (local_7c = 0; local_7c < global_variables_count; local_7c = local_7c + 1) {
    if (global_variables[local_7c].is_array == 0) {
      sprintf(buf,"  %s %s;\n",global_variables + local_7c,global_variables[local_7c].name);
    }
    else {
      sprintf(buf,"  %s %s[%d];\n",global_variables + local_7c,global_variables[local_7c].name,
              (ulong)(uint)global_variables[local_7c].array_length);
    }
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  for (local_80 = 0; local_80 < global_variables_count; local_80 = local_80 + 1) {
    if (global_variables[local_80].skip_initialisation == 0) {
      local_88 = "";
      if (global_variables[local_80].is_nrnglobal != 0) {
        local_88 = suffix;
      }
      if (global_variables[local_80].is_array == 0) {
        sprintf(buf,"  _global_variables->%s = %s%s;\n",global_variables[local_80].name,
                global_variables[local_80].name,local_88);
        lappendstr((List *)list,p);
      }
      else {
        for (local_8c = 0; (int)local_8c < global_variables[local_80].array_length;
            local_8c = local_8c + 1) {
          p = (char *)CONCAT44((int)((ulong)p >> 0x20),local_8c);
          sprintf(buf,"  _global_variables->%s[%d] = %s%s[%d];\n",global_variables[local_80].name,
                  (ulong)local_8c,global_variables[local_80].name,local_88);
          lappendstr((List *)list,p);
        }
      }
    }
  }
  if (artificial_cell == 0) {
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  for (local_90 = 0; local_90 < global_variables_count; local_90 = local_90 + 1) {
    sprintf(buf,"#define %s static_cast<_global_variables_t*>(_ml->global_variables)->%s\n",
            global_variables[local_90].name,global_variables[local_90].name);
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  for (local_20 = rangeparm->next; local_20 != rangeparm; local_20 = local_20->next) {
    pSVar1 = (local_20->element).sym;
    if ((pSVar1->subtype & 0x20U) == 0) {
      decode_ustr(in_stack_ffffffffffffff10,(double *)sym_00,(double *)pg2,sym);
      sprintf(buf,"\t%s = %g;\n",local_48,pSVar1->name);
      lappendstr((List *)list,p);
    }
  }
  if (diamdec != 0) {
    ppvar_semantics((int)((ulong)list >> 0x20),p);
  }
  if (areadec != 0) {
    ppvar_semantics((int)((ulong)list >> 0x20),p);
  }
  if (point_process == 0) {
    local_c = 0;
  }
  else {
    local_c = 2;
  }
  local_20 = useion->next;
  while (local_20 != useion) {
    bVar4 = false;
    bVar3 = false;
    pSVar1 = (local_20->element).sym;
    sprintf(buf,"prop_ion = need_memb(_%s_sym);\n",pSVar1->name);
    lappendstr((List *)list,p);
    if (ldifuslist != (List *)0x0) {
      sprintf(buf," _type_i%s = prop_ion->_type;\n",pSVar1->name);
      lappendstr((List *)list,p);
    }
    ion_promote((Item *)s_00);
    pIVar8 = local_20->next;
    for (local_28 = ((pIVar8->element).itm)->next; local_28 != (pIVar8->element).itm;
        local_28 = local_28->next) {
      ((local_28->element).sym)->nrntype = ((local_28->element).sym)->nrntype | 0x200;
      uVar7 = iontype(p,(char *)0x10863a);
      sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* %s */\n",(ulong)local_c,
              (ulong)uVar7,((local_28->element).sym)->name);
      lappendstr((List *)list,p);
      local_c = local_c + 1;
    }
    pIVar8 = pIVar8->next;
    for (local_28 = ((pIVar8->element).itm)->next; local_28 != (pIVar8->element).itm;
        local_28 = local_28->next) {
      uVar7 = iontype(p,(char *)0x1086fa);
      if ((((local_28->element).sym)->nrntype & 0x200U) == 0) {
        uVar10 = (ulong)local_c;
        local_c = local_c + 1;
        sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* %s */\n",uVar10,(ulong)uVar7,
                ((local_28->element).sym)->name);
        lappendstr((List *)list,p);
      }
      else {
        ((local_28->element).sym)->nrntype = ((local_28->element).sym)->nrntype & 0xfdff;
      }
      if (uVar7 == 3) {
        bVar4 = true;
        uVar10 = (ulong)local_c;
        local_c = local_c + 1;
        sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* _ion_di%sdv */\n",uVar10,4,
                pSVar1->name);
        lappendstr((List *)list,p);
      }
      if ((uVar7 == 1) || (uVar7 == 2)) {
        bVar3 = true;
      }
    }
    if (bVar3) {
      uVar10 = (ulong)local_c;
      local_c = local_c + 1;
      sprintf(buf,"\t_ppvar[%d]._pvoid = (void*)(&(prop_ion->dparam[0]._i)); /* iontype for %s */\n"
              ,uVar10,pSVar1->name);
      lappendstr((List *)list,p);
    }
    pIVar8 = pIVar8->next;
    if ((!bVar4) && (ldifuslist != (List *)0x0)) {
      uVar10 = (ulong)local_c;
      local_c = local_c + 1;
      sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* _ion_di%sdv */\n",uVar10,4,
              pSVar1->name);
      lappendstr((List *)list,p);
    }
    local_20 = pIVar8->next;
  }
  lappendstr((List *)list,p);
  if (constructorfunc->next != constructorfunc) {
    lappendstr((List *)list,p);
    if (vectorize == 0) {
      lappendstr((List *)list,p);
    }
    else {
      lappendstr((List *)list,p);
    }
    movelist((Item *)list,(Item *)p,(List *)0x1089bf);
    lappendstr((List *)list,p);
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if (cvode_emit != 0) {
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    for (local_20 = rangestate->next; local_20 != rangestate; local_20 = local_20->next) {
      pSVar1 = (local_20->element).sym;
      iVar5 = decode_tolerance((Symbol *)sym,(double *)s_00);
      if (iVar5 != 0) {
        if (point_process == 0) {
          sprintf(buf,"\"%s%s\", %g,\n",local_a8,pSVar1->name,suffix);
        }
        else {
          sprintf(buf,"\"%s\", %g,\n",local_a8,pSVar1->name);
        }
        lappendstr((List *)list,p);
      }
    }
    lappendstr((List *)list,p);
  }
  if (singlechan_ != 0) {
    sprintf(buf,"static _singlechan_declare%d();\n",(ulong)(uint)singlechan_);
    lappendstr((List *)list,p);
  }
  if (net_send_seen_ != 0) {
    if (net_receive_ == 0) {
      diag(list,p);
    }
    sprintf(buf,"\n#define _tqitem &(_nt->_vdata[_ppvar[%d*_STRIDE]])\n",(ulong)(uint)tqitem_index);
    lappendstr((List *)list,p);
    if (net_receive_buffering_ != 0) {
      sprintf(buf,
              "\n#if NET_RECEIVE_BUFFERING\n#undef _tqitem\n#define _tqitem _ppvar[%d*_STRIDE]\n#endif\n\n"
              ,(ulong)(uint)tqitem_index);
      lappendstr((List *)list,p);
    }
    if (net_send_delivered_ != (Item *)0x0) {
      insertstr((Item *)list,p);
    }
  }
  if ((net_receive_ != 0) && (lappendstr((List *)list,p), net_init_q1_ != (Item *)0x0)) {
    lappendstr((List *)list,p);
  }
  if ((vectorize != 0) && (thread_mem_init_list->next != thread_mem_init_list)) {
    lappendstr((List *)list,p);
  }
  if ((vectorize != 0) && (thread_cleanup_list->next != thread_cleanup_list)) {
    lappendstr((List *)list,p);
  }
  if (uip != (List *)0x0) {
    lappendstr((List *)list,p);
  }
  sprintf(buf,"\n#define _psize %d\n#define _ppsize %d\n",(ulong)(uint)parraycount,
          (ulong)(uint)ppvar_cnt);
  lappendstr((List *)list,p);
  sprintf(buf,"void _%s_reg() {\n\tint _vectorized = %d;\n",modbase,(ulong)(uint)vectorize);
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if (suffix[0] != '\0') {
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    lappendstr((List *)list,p);
    for (local_20 = useion->next; local_20 != useion; local_20 = local_20->next->next->next->next) {
      sprintf(buf,"_%s_type = nrn_get_mechtype(\"%s_ion\");",((local_20->element).sym)->name,
              ((local_20->element).sym)->name);
      lappendstr((List *)list,p);
    }
    lappendstr((List *)list,p);
    for (local_20 = useion->next; local_20 != useion; local_20 = local_20->next->next->next->next) {
      sprintf(buf,"\tion_reg(\"%s\", %s);\n",((local_20->element).sym)->name,
              (local_20->next->next->next->element).itm);
      lappendstr((List *)list,p);
    }
    if (diamdec != 0) {
      lappendstr((List *)list,p);
    }
    for (local_20 = useion->next; local_20 != useion; local_20 = local_20->next->next->next->next) {
      sprintf(buf,"\t_%s_sym = hoc_lookup(\"%s_ion\");\n",((local_20->element).sym)->name,
              ((local_20->element).sym)->name);
      lappendstr((List *)list,p);
    }
    lappendstr((List *)list,p);
    if (point_process == 0) {
      if (vectorize == 0) {
        local_e4 = 0;
      }
      else {
        local_e4 = thread_data_index + 1;
      }
      sprintf(buf,
              " register_mech(_mechanism, nrn_alloc,%s, nrn_init, _create_global_variables, _destroy_global_variables, hoc_nrnpointerindex, %d);\n"
              ,brkpnt_str_,(ulong)local_e4);
      lappendstr((List *)list,p);
    }
    else {
      if (vectorize == 0) {
        local_d4 = 0;
      }
      else {
        local_d4 = thread_data_index + 1;
      }
      sprintf(buf,
              "\t_pointtype = point_register_mech(_mechanism,\n\t nrn_alloc,%s, nrn_init, _create_global_variables, _destroy_global_variables,\n\t hoc_nrnpointerindex,\n\t NULL/*_hoc_create_pnt*/, NULL/*_hoc_destroy_pnt*/, /*_member_func,*/\n\t %d);\n"
              ,brkpnt_str_,(ulong)local_d4);
      lappendstr((List *)list,p);
      if (destructorfunc->next != destructorfunc) {
        lappendstr((List *)list,p);
      }
    }
    if ((vectorize != 0) && (thread_data_index != 0)) {
      sprintf(buf," _extcall_thread = (ThreadDatum*)ecalloc(%d, sizeof(ThreadDatum));\n",
              (ulong)(uint)thread_data_index);
      lappendstr((List *)list,p);
      if ((thread_mem_init_list->next != thread_mem_init_list) &&
         (lappendstr((List *)list,p), local_14 != 0)) {
        lappendstr((List *)list,p);
      }
    }
    if (vectorize != 0) {
      insertstr((Item *)list,p);
      if (thread_data_index != 0) {
        sprintf(buf,", _thread[0:%d]",(ulong)(uint)thread_data_index);
        insertstr((Item *)list,p);
      }
      insertstr((Item *)list,p);
    }
    if ((vectorize != 0) && (thread_mem_init_list->next != thread_mem_init_list)) {
      lappendstr((List *)list,p);
    }
    if ((vectorize != 0) && (thread_cleanup_list->next != thread_cleanup_list)) {
      lappendstr((List *)list,p);
    }
    if (bVar2) {
      lappendstr((List *)list,p);
    }
    if (use_bbcorepointer != 0) {
      lappendstr((List *)list,p);
      lappendstr((List *)list,p);
    }
    sprintf(buf," hoc_register_prop_size(_mechtype, _psize, _ppsize);\n");
    lappendstr((List *)list,p);
    if (ppvar_semantics_ != (List *)0x0) {
      for (local_20 = ppvar_semantics_->next; local_20 != ppvar_semantics_;
          local_20 = local_20->next) {
        sprintf(buf," hoc_register_dparam_semantics(_mechtype, %d, \"%s\");\n",
                (ulong)(uint)(int)local_20->itemtype,(local_20->element).itm);
        lappendstr((List *)list,p);
      }
    }
    local_4 = 0;
    for (local_20 = useion->next; local_20 != useion; local_20 = local_20->next->next->next->next) {
      for (local_28 = ((local_20->next->next->element).itm)->next;
          local_28 != (local_20->next->next->element).itm; local_28 = local_28->next) {
        iVar5 = iontype(p,(char *)0x10942a);
        if ((iVar5 == 1) || (iVar5 == 2)) {
          local_4 = local_4 + 1;
        }
      }
    }
    if (local_4 != 0) {
      lappendstr((List *)list,p);
    }
    printf("cvode_emit=%d cvode_not_allowed=%d\n",(ulong)(uint)cvode_emit,
           (ulong)(uint)cvode_not_allowed);
    if (cvode_emit != 0) {
      lappendstr((List *)list,p);
      lappendstr((List *)list,p);
      if (ion_synonym != (List *)0x0) {
        lappendstr((List *)list,p);
      }
    }
    if (singlechan_ != 0) {
      sprintf(buf,"hoc_reg_singlechan(_mechtype, _singlechan_declare%d);\n",(ulong)(uint)singlechan_
             );
      lappendstr((List *)list,p);
    }
    if (artificial_cell != 0) {
      if ((((brkpnt_exists != 0) || (net_receive_ == 0)) || (nrnpointers->next != nrnpointers)) ||
         (useion->next != useion)) {
        printf(
              "Notice: ARTIFICIAL_CELL is a synonym for POINT_PROCESS which hints that it\nonly affects and is affected by discrete events. As such it is not\nlocated in a section and is not associated with an integrator\n"
              );
      }
      sprintf(buf,"add_nrn_artcell(_mechtype, %d);\n",(ulong)(uint)tqitem_index);
      lappendstr((List *)list,p);
    }
    if (net_event_seen_ != 0) {
      lappendstr((List *)list,p);
    }
    if (watch_seen_ != 0) {
      lappendstr((List *)list,p);
    }
    if ((net_receive_buffering_ != 0) &&
       ((lappendstr((List *)list,p), net_send_seen_ != 0 || (net_event_seen_ != 0)))) {
      lappendstr((List *)list,p);
    }
    if (net_receive_ != 0) {
      if (net_init_q1_ == (Item *)0x0) {
        sprintf(buf,"set_pnt_receive(_mechtype, _net_receive, nullptr, %d);\n",
                (ulong)(uint)net_receive_);
      }
      else {
        sprintf(buf,"set_pnt_receive(_mechtype, _net_receive, _net_init, %d);\n",
                (ulong)(uint)net_receive_);
      }
      lappendstr((List *)list,p);
    }
    if (for_netcons_ != 0) {
      sprintf(buf,"add_nrn_fornetcons(_mechtype, _fnc_index);\n");
      lappendstr((List *)list,p);
    }
    local_20 = ba_list_;
    for (local_4 = 1; (int)local_4 <= ba_index_; local_4 = local_4 + 1) {
      pIVar8 = local_20->next;
      pLVar9 = get_ion_variables((int)((ulong)list >> 0x20));
      if (pLVar9->next != pLVar9->prev) {
        move((Item *)list,(Item *)p,(Item *)0x109788);
        freelist((List **)list);
      }
      pIVar8 = pIVar8->next;
      pLVar9 = set_ion_variables((int)((ulong)pg2 >> 0x20));
      if (pLVar9->next != pLVar9->prev) {
        move((Item *)list,(Item *)p,(Item *)0x1097ed);
        freelist((List **)list);
      }
      local_20 = pIVar8->next;
      sprintf(buf,"\thoc_reg_ba(_mechtype, _ba%d, %s);\n",(ulong)local_4,(local_20->element).itm);
      lappendstr((List *)list,p);
    }
    if (ldifuslist != (List *)0x0) {
      lappendstr((List *)list,p);
      linsertstr((List *)list,p);
    }
  }
  lappendstr((List *)list,p);
  lappendstr((List *)list,p);
  if ((vectorize != 0) && (thread_mem_init_list->next != thread_mem_init_list)) {
    lappendstr((List *)list,p);
    move((Item *)list,(Item *)p,(Item *)0x10991f);
    lappendstr((List *)list,p);
  }
  if ((vectorize != 0) && (thread_cleanup_list->next != thread_cleanup_list)) {
    lappendstr((List *)list,p);
    move((Item *)list,(Item *)p,(Item *)0x109993);
    lappendstr((List *)list,p);
  }
  if (uip != (List *)0x0) {
    move((Item *)list,(Item *)p,(Item *)0x1099dc);
  }
  if (destructorfunc->next != destructorfunc) {
    if (vectorize == 0) {
      lappendstr((List *)list,p);
    }
    else {
      lappendstr((List *)list,p);
    }
    movelist((Item *)list,(Item *)p,(List *)0x109a62);
    lappendstr((List *)list,p);
  }
  if (ldifuslist != (List *)0x0) {
    ldifusreg();
  }
  if (watch_seen_ != 0) {
    emit_nrn_watch_check_code();
  }
  for (local_4 = 0x41; (int)local_4 < 0x7b; local_4 = local_4 + 1) {
    for (local_20 = symlist[(int)local_4]->next; local_20 != symlist[(int)local_4];
        local_20 = local_20->next) {
      if ((((local_20->element).sym)->subtype & 2U) != 0) {
        warn_ignore((Symbol *)s_00);
      }
    }
  }
  return;
}

Assistant:

void parout() {
	int i, j, ioncount, pointercount, gind, emit_check_table_thread;
	Item *q, *q1, *extra_pragma_loop_arg;
	Symbol *s, *sion;
	double d1, d2;

#if BBCORE
	cvode_emit = 0;
#endif

	defs_list = newlist();	/* relates hoc names to c-variables */
	if (brkpnt_exists) {
	    if (vectorize) {
		brkpnt_str_ = "nrn_cur, NULL, nrn_state";
	    }else{
		brkpnt_str_ = "nrn_cur, nrn_jacob, nrn_state";
	    }
	}else{
		brkpnt_str_ = "0, 0, 0";
#if 1 || defined(__MINGW32__)
		/* x86_64-w64-mingw32-gcc passed 0 without zeroing the high 32 bits */
		/* also cygwin64 gcc 4.8.1, so cast to void* universally */
		brkpnt_str_ = "NULL, NULL, NULL";
#endif
	}

	set_suffix();	

	if (artificial_cell && vectorize && (thread_data_index || toplocal_)) {
fprintf(stderr, "Notice: ARTIFICIAL_CELL models that would require thread specific data are not thread safe.\n");	
		vectorize = 0;
	}
	if (point_process) {
		rsuffix = "";
	}else{
		rsuffix = suffix;
	}

	if (point_process && !artificial_cell && net_receive_) {
	  	net_receive_buffering_ = 1;
		emit_net_receive_buffering_code();
	}

	Lappendstr(defs_list, "\
\n#include \"coreneuron/utils/randoms/nrnran123.h\"\
\n#include \"coreneuron/nrnoc/md1redef.h\"\
\n#include \"coreneuron/nrnconf.h\"\
\n#include \"coreneuron/sim/multicore.hpp\"\
\n#include \"coreneuron/nrniv/nrniv_decl.h\"\
\n#include \"coreneuron/utils/ivocvect.hpp\"\
\n#include \"coreneuron/utils/nrnoc_aux.hpp\"\
\n#include \"coreneuron/gpu/nrn_acc_manager.hpp\"\
\n#include \"coreneuron/sim/scopmath/newton_struct.h\"\
\n#include \"coreneuron/sim/scopmath/newton_thread.hpp\"\
\n#include \"coreneuron/sim/scopmath/sparse_thread.hpp\"\
\n#include \"coreneuron/sim/scopmath/ssimplic_thread.hpp\"\
\n#include \"coreneuron/nrnoc/md2redef.h\"\
\n#include \"coreneuron/mechanism/register_mech.hpp\"\
\n#if !NRNGPU\
\n#if !defined(DISABLE_HOC_EXP)\
\n#undef exp\
\n#define exp hoc_Exp\
\n#endif\
\n#endif\n\
");
	if (use_bbcorepointer) {
        Lappendstr(defs_list, "#define _threadargsproto_namespace int _iml, int _cntml_padded, double* _p, coreneuron::Datum* _ppvar, coreneuron::ThreadDatum* _thread, coreneuron::NrnThread* _nt, coreneuron::Memb_list* _ml, double v\n");

		lappendstr(defs_list, "static void bbcore_read(double *, int*, int*, int*, _threadargsproto_namespace);\n");
		lappendstr(defs_list, "static void bbcore_write(double *, int*, int*, int*, _threadargsproto_namespace);\n");
	}

	Lappendstr(defs_list, "namespace coreneuron {\n");
	if (vectorize) {
        /* macros for compiler dependent ivdep like pragma and memory layout. INIT and STATE pragma are same
         * except that sync clause absent because we saw issue only in CaDynamics_E2 */
		lappendstr(defs_list, "\
\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\
\n#include <openacc.h>\
\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], nrn_ion_global_map[0:nrn_ion_global_map_size][0:ion_global_map_member_size], _nt[0:1] _thread_present_) if(_nt->compute_gpu)\")\
\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _nt[0:1], _ml[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_shadow_rhs[0:_nt->shadow_rhs_cnt], _vec_shadow_d[0:_nt->shadow_rhs_cnt], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1]) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"acc parallel loop present(_pnt[0:_pnt_length], _nrb[0:1], _nt[0:1], nrn_threads[0:nrn_nthread]) if(_nt->compute_gpu) async(stream_id)\")\
\n#else\
\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"\")\
\n#endif\
\n \
\n#if !defined(LAYOUT)\
\n/* 1 means AoS, >1 means AoSoA, <= 0 means SOA */\
\n#define LAYOUT 1\
\n#endif\
\n#if LAYOUT >= 1\
\n#define _STRIDE LAYOUT\
\n#else\
\n#define _STRIDE _cntml_padded + _iml\
\n#endif\
\n");

       // if protect is used then do not enable vectorisation with ivdep like pragmas
       // mod2c doesn't have fine grain mechanism to check where PROTECT appears (e.g. via AST)
       // and hence just disable vectorisation at the top level (usage of PROTECT is/would be rare
       // and not critical in mod2c anyway)
       if (protect_include_) {
           extra_pragma_loop_arg = insertstr(defs_list, "\n#define _PRAGMA_FOR_VECTOR_LOOP_\n");
       } else {
           extra_pragma_loop_arg = insertstr(defs_list, "\n"
               "\n#if defined(__ICC) || defined(__INTEL_COMPILER) || defined(__INTEL_LLVM_COMPILER)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ivdep\")"
               "\n#elif defined(__IBMC__) || defined(__IBMCPP__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ibm independent_loop\")"
               "\n#elif defined(__PGI)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"vector\")"
               "\n#elif defined(_CRAYC)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"_CRI ivdep\")"
               "\n#elif defined(__clang__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"clang loop vectorize(enable)\")"
               "\n#elif defined(__GNUC__) || defined(__GNUG__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"GCC ivdep\")"
               "\n#else"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_"
               "\n#endif // _PRAGMA_FOR_VECTOR_LOOP_\n");
       }

	}else{
		Lappendstr(defs_list, "\
\n#undef LAYOUT\
\n#define LAYOUT 1\
\n#define _STRIDE 1\
\n");
	}

	if (net_receive_buffering_) {
		Lappendstr(defs_list, "\
\n\
\n#if !defined(NET_RECEIVE_BUFFERING)\
\n#define NET_RECEIVE_BUFFERING 1\
\n#endif\
\n");
	}

#if 1
	/* for easier profiling, give distinct names to otherwise reused static names */
	sprintf(buf, "\n\
#define nrn_init _nrn_init_%s\n\
#define nrn_cur _nrn_cur_%s\n\
#define _nrn_current _nrn_current_%s\n\
#define nrn_jacob _nrn_jacob_%s\n\
#define nrn_state _nrn_state_%s\n\
#define initmodel initmodel_%s\n\
#define _net_receive _net_receive_%s\n\
#define _net_init _net_init_%s\n\
#define nrn_state_launcher nrn_state%s_launcher\n\
#define nrn_cur_launcher nrn_cur%s_launcher\n\
#define nrn_jacob_launcher nrn_jacob%s_launcher\
", suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix);
	Lappendstr(defs_list, buf);

	if (net_receive_buffering_) {
		sprintf(buf, "\
\n#if NET_RECEIVE_BUFFERING\
\n#define _net_buf_receive _net_buf_receive%s\
\nvoid _net_buf_receive(NrnThread*);\
\n#endif\
\n", suffix);
		Lappendstr(defs_list, buf);
	}

	if (watch_seen_) {
		sprintf(buf,
"\n#define _nrn_watch_check _nrn_watch_check_%s", suffix);
		Lappendstr(defs_list, buf);
	}

	SYMLISTITER {
		Symbol* s = SYM(q);
		/* note that with GLOBFUNCT, FUNCT will be redefined anyway */
		if (s->type == NAME && s->subtype & (PROCED | DERF | KINF)) {
			sprintf(buf, "\n#define %s %s%s", s->name, s->name, suffix);
			Lappendstr(defs_list, buf);
		}
	}
	Lappendstr(defs_list, "\n");
#endif /* distinct names for easier profiling */

	Lappendstr(defs_list, "\n\
#undef _threadargscomma_\n\
#undef _threadargsprotocomma_\n\
#undef _threadargs_\n\
#undef _threadargsproto_\n\
");
	if (vectorize) {
		Lappendstr(defs_list, "\n\
#define _threadargscomma_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v,\n\
#define _threadargsprotocomma_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v,\n\
#define _threadargs_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v\n\
#define _threadargsproto_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v\n\
");
}else{
		Lappendstr(defs_list, "\n\
#define _threadargscomma_ /**/\n\
#define _threadargsprotocomma_ /**/\n\
#define _threadargs_ /**/\n\
#define _threadargsproto_ /**/\n\
");
}

	Lappendstr(defs_list, "\
	/*SUPPRESS 761*/\n\
	/*SUPPRESS 762*/\n\
	/*SUPPRESS 763*/\n\
	/*SUPPRESS 765*/\n\
	");
#if VECTORIZE
    if (vectorize) {
	Sprintf(buf, "/* Thread safe. No static _p or _ppvar. */\n");
    }else
#endif
    {
	Sprintf(buf, "static double *_p; static Datum *_ppvar;\n");
    }
	Lappendstr(defs_list, buf);

	nrndeclare();
	varcount = parraycount = 0;
	declare_p();
	ioncount = iondef(&pointercount); /* first is _nd_area if point process */
	Lappendstr(defs_list, "\n#if MAC\n#if !defined(v)\n#define v _mlhv\n#endif\n#if !defined(h)\n#define h _mlhh\n#endif\n#endif\n");
	Lappendstr(defs_list, "static int hoc_nrnpointerindex = ");
	if (pointercount) {
		q = nrnpointers->next;
		Sprintf(buf, "%d;\n", SYM(q)->used);
	}else{
		Sprintf(buf, "-1;\n");
	}
	Lappendstr(defs_list, buf);
	/*above modified to also count and define pointers*/
	
	if (vectorize) {
		Lappendstr(defs_list, "static ThreadDatum* _extcall_thread;\n");
	}
#if 0
	Lappendstr(defs_list, "/* static variables special to NEURON */\n");
	SYMLISTITER {
		if (SYM(q)->nrntype & NRNSTATIC) {
			Sprintf(buf, "static double %s;\n", SYM(q)->name);
			Lappendstr(defs_list, buf);
		}
	}
#endif

	Lappendstr(defs_list, "/* external NEURON variables */\n");
	int add_celsius  = 0;
	int redefine_nrn_ghk = 0;
	SYMLISTITER {
		s = SYM(q);
		if(strcmp(s->name, "nrn_ghk") == 0 && s->subtype & EXTDEF) {
			add_celsius = 1;
			redefine_nrn_ghk = 1;
		}
		if (s->nrntype & NRNEXTRN) {
			if (strcmp(s->name, "celsius") == 0) {
				add_celsius = 1;
				continue;
			}
			if (strcmp(s->name, "dt") == 0) { continue; }
			if (strcmp(s->name, "t") == 0) { continue; }
			if (s->subtype & ARRAY) {
				Sprintf(buf, "extern double* %s;\n", s->name);
			}else{
				Sprintf(buf, "extern double %s;\n", s->name);
			}
			Lappendstr(defs_list, buf);
			// following are remaining two global variables used as extern from
			// coreneuron side and hence add them to global variable list.
			if (strcmp(s->name, "secondorder") || strcmp(s->name, "pi"))  {
				add_global_var("double", s->name, 0, 0, 0, 0);
            }
        }
    }